

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  bool bVar1;
  ulong uVar2;
  uint64_t old_value_1;
  uint32_t digit_1;
  uint64_t old_value;
  ulong uStack_30;
  uint32_t digit;
  uint64_t value;
  uint64_t *out_local;
  char *end_local;
  char *s_local;
  
  value = (uint64_t)out;
  out_local = (uint64_t *)end;
  end_local = s;
  if (s == end) {
    Result::Result((Result *)((long)&s_local + 4),Error);
  }
  else {
    uStack_30 = 0;
    if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
      end_local = s + 2;
      if (end_local == end) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      for (; end_local < out_local; end_local = end_local + 1) {
        if (*end_local != '_') {
          old_value._0_4_ = ParseHexdigit(*end_local,(uint32_t *)((long)&old_value + 4));
          bVar1 = Failed(old_value._0_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
          uVar2 = uStack_30 * 0x10 + (ulong)old_value._4_4_;
          bVar1 = uVar2 < uStack_30;
          uStack_30 = uVar2;
          if (bVar1) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
        }
      }
    }
    else {
      for (; end_local < end; end_local = end_local + 1) {
        if (*end_local != '_') {
          if (9 < (int)*end_local - 0x30U) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
          uVar2 = uStack_30 * 10 + (ulong)((int)*end_local - 0x30U);
          bVar1 = uVar2 < uStack_30;
          uStack_30 = uVar2;
          if (bVar1) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
        }
      }
    }
    if ((uint64_t *)end_local == out_local) {
      *(ulong *)value = uStack_30;
      Result::Result((Result *)((long)&s_local + 4),Ok);
    }
    else {
      Result::Result((Result *)((long)&s_local + 4),Error);
    }
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      uint64_t old_value = value;
      value = value * 16 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  } else {
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      uint64_t old_value = value;
      value = value * 10 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}